

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O1

void * pack_thread(void *pargs)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ssize_t sVar3;
  char *pcVar4;
  stat st;
  char parent [256];
  char parent_file [1024];
  char host [1024];
  stat local_9c8;
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  __dirp = opendir(*(char **)((long)pargs + 0x38));
  if (__dirp == (DIR *)0x0) {
    pack_thread_cold_2();
  }
  else {
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      do {
        pcVar4 = pdVar2->d_name;
        iVar1 = strcmp(pcVar4,".");
        if ((iVar1 != 0) && (iVar1 = strcmp(pcVar4,".."), iVar1 != 0)) {
          snprintf(local_438,0x400,"%s/%s",*(undefined8 *)((long)pargs + 0x38),pcVar4);
          iVar1 = stat(local_438,&local_9c8);
          if (iVar1 < 0) {
            pack_thread_cold_1();
            break;
          }
          if ((local_9c8.st_mode & 0xf000) == 0x4000) {
            snprintf(local_838,0x400,"%s/%s",local_438,"VITA_PATH.TXT");
            iVar1 = open(local_838,0);
            if (-1 < iVar1) {
              sVar3 = read_block(iVar1,local_938,0xff);
              if (sVar3 < 0) {
                fprintf(_stderr,"error reading %s\n",local_838);
              }
              else {
                close(iVar1);
                local_938[sVar3] = '\0';
                printf("adding files for %s\n",local_938);
                sVar3 = add_all_files(*(int *)((long)pargs + 4),local_938,"",local_438);
                if (-1 < sVar3) {
                  *(long *)((long)pargs + 0x40) = *(long *)((long)pargs + 0x40) + sVar3;
                  goto LAB_00103188;
                }
              }
              break;
            }
            pcVar4 = "WARNING: skipping %s because VITA_PATH.TXT is not found!\n";
          }
          else {
            pcVar4 = "WARNING: skipping %s because it is not a directory!\n";
          }
          fprintf(_stderr,pcVar4,local_438);
        }
LAB_00103188:
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *pack_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  DIR *dir;
  struct dirent *dent;
  struct stat st;
  char parent[256];
  char host[MAX_PATH_LEN];
  char parent_file[MAX_PATH_LEN];
  int fd;
  ssize_t rd, wr;
  
  if ((dir = opendir(args->prefix)) == NULL) {
    fprintf(stderr, "cannot open %s\n", args->prefix);
    goto end2;
  }

  while ((dent = readdir(dir)) != NULL) {
    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    snprintf(host, sizeof(host), "%s/%s", args->prefix, dent->d_name);
    if (stat(host, &st) < 0) {
      fprintf(stderr, "internal error\n");
      goto end;
    }

    if (S_ISDIR(st.st_mode)) {
      snprintf(parent_file, sizeof(parent_file), "%s/%s", host, "VITA_PATH.TXT");
      if ((fd = open(parent_file, O_RDONLY | O_BINARY)) < 0) {
        fprintf(stderr, "WARNING: skipping %s because VITA_PATH.TXT is not found!\n", host);
        continue;
      }
      if ((rd = read_block(fd, parent, sizeof(parent)-1)) < 0) {
        fprintf(stderr, "error reading %s\n", parent_file);
        goto end;
      }
      close(fd);
      parent[rd] = '\0';
      dent = NULL; // so we don't actually reuse it
      printf("adding files for %s\n", parent);
      if ((wr = add_all_files(args->out, parent, "\0", host)) < 0) {
        goto end;
      }
      args->content_size += wr;
    } else {
      fprintf(stderr, "WARNING: skipping %s because it is not a directory!\n", host);
    }
  }
  
end:
  closedir(dir);
end2:
  close(args->out);
  close(args->in);
  return NULL;
}